

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O2

int mbedtls_x509_crl_parse_der(mbedtls_x509_crl *chain,uchar *buf,size_t buflen)

{
  int *val;
  size_t *len_00;
  size_t __n;
  int iVar1;
  mbedtls_x509_crl *__s;
  uchar *puVar2;
  mbedtls_x509_crl_entry *pmVar3;
  mbedtls_x509_crl *crl;
  uchar *puVar4;
  mbedtls_x509_crl_entry *pmVar5;
  uchar *p;
  size_t len;
  size_t local_a8;
  uchar *local_a0;
  mbedtls_x509_buf sig_params1;
  size_t local_78;
  size_t entry_len;
  mbedtls_x509_buf sig_oid2;
  mbedtls_x509_buf sig_params2;
  
  if (buf == (uchar *)0x0 || chain == (mbedtls_x509_crl *)0x0) {
    return -0x2800;
  }
  sig_params1.tag = 0;
  sig_params1._4_4_ = 0;
  sig_params1.len = 0;
  sig_params1.p = (uchar *)0x0;
  sig_params2.tag = 0;
  sig_params2._4_4_ = 0;
  sig_params2.len = 0;
  sig_params2.p = (uchar *)0x0;
  sig_oid2.tag = 0;
  sig_oid2._4_4_ = 0;
  sig_oid2.len = 0;
  sig_oid2.p = (uchar *)0x0;
  do {
    crl = chain;
    if (crl->version == 0) goto LAB_0010b4e7;
    chain = crl->next;
  } while (crl->next != (mbedtls_x509_crl *)0x0);
  __s = (mbedtls_x509_crl *)calloc(1,0x1a0);
  crl->next = __s;
  if (__s == (mbedtls_x509_crl *)0x0) {
    mbedtls_x509_crl_free(crl);
    return -0x2880;
  }
  memset(__s,0,0x1a0);
  crl = crl->next;
LAB_0010b4e7:
  puVar2 = (uchar *)calloc(1,buflen);
  if (puVar2 == (uchar *)0x0) {
    return -0x2880;
  }
  p = puVar2;
  memcpy(puVar2,buf,buflen);
  (crl->raw).p = puVar2;
  (crl->raw).len = buflen;
  puVar2 = puVar2 + buflen;
  iVar1 = mbedtls_asn1_get_tag(&p,puVar2,&len,0x30);
  if (iVar1 != 0) {
    mbedtls_x509_crl_free(crl);
    return -0x2180;
  }
  if (len != (long)puVar2 - (long)p) goto LAB_0010b8ef;
  (crl->tbs).p = p;
  iVar1 = mbedtls_asn1_get_tag(&p,puVar2,&len,0x30);
  if (iVar1 != 0) {
LAB_0010b571:
    mbedtls_x509_crl_free(crl);
    return iVar1 + -0x2180;
  }
  puVar2 = p + len;
  (crl->tbs).len = (long)puVar2 - (long)(crl->tbs).p;
  val = &crl->version;
  iVar1 = mbedtls_asn1_get_int(&p,puVar2,val);
  if (iVar1 != 0) {
    if (iVar1 == -0x62) {
      *val = 0;
    }
    else {
      iVar1 = iVar1 + -0x2200;
      if (iVar1 != 0) goto LAB_0010b5ff;
    }
  }
  iVar1 = mbedtls_x509_get_alg(&p,puVar2,&crl->sig_oid,&sig_params1);
  if (iVar1 == 0) {
    iVar1 = *val;
    *val = iVar1 + 1;
    if (1 < iVar1) {
      mbedtls_x509_crl_free(crl);
      return -0x2580;
    }
    iVar1 = mbedtls_x509_get_sig_alg
                      (&crl->sig_oid,&sig_params1,&crl->sig_md,&crl->sig_pk,&crl->sig_opts);
    if (iVar1 != 0) {
      mbedtls_x509_crl_free(crl);
      return -0x2600;
    }
    (crl->issuer_raw).p = p;
    iVar1 = mbedtls_asn1_get_tag(&p,puVar2,&len,0x30);
    if (iVar1 != 0) goto LAB_0010b571;
    iVar1 = mbedtls_x509_get_name(&p,p + len,&crl->issuer);
    if (iVar1 == 0) {
      (crl->issuer_raw).len = (long)p - (long)(crl->issuer_raw).p;
      iVar1 = mbedtls_x509_get_time(&p,puVar2,&crl->this_update);
      if ((iVar1 == 0) &&
         (((iVar1 = mbedtls_x509_get_time(&p,puVar2,&crl->next_update), iVar1 == -0x2462 ||
           (iVar1 == -0x2460)) || (iVar1 == 0)))) {
        if ((p == puVar2) ||
           (iVar1 = mbedtls_asn1_get_tag(&p,puVar2,&entry_len,0x30), iVar1 == -0x62)) {
LAB_0010b86a:
          if (*val == 2) {
            local_a8 = 0;
            iVar1 = mbedtls_x509_get_ext(&p,puVar2,&crl->crl_ext,0);
            if (iVar1 != -0x62) {
              if (iVar1 == 0) {
                for (; p < puVar2; p = p + local_a8) {
                  iVar1 = mbedtls_asn1_get_tag(&p,puVar2,&local_a8,0x30);
                  if (iVar1 != 0) {
                    iVar1 = iVar1 + -0x2500;
                    goto LAB_0010b8e1;
                  }
                }
                if (p != puVar2) {
LAB_0010b8cf:
                  iVar1 = -0x2566;
                  goto LAB_0010b5ff;
                }
              }
              else {
LAB_0010b8e1:
                if (iVar1 != 0) goto LAB_0010b5ff;
              }
            }
          }
          if (p != puVar2) {
LAB_0010b8ef:
            mbedtls_x509_crl_free(crl);
            return -0x21e6;
          }
          puVar2 = (crl->raw).p + (crl->raw).len;
          iVar1 = mbedtls_x509_get_alg(&p,puVar2,&sig_oid2,&sig_params2);
          if (iVar1 == 0) {
            __n = (crl->sig_oid).len;
            if (((__n != sig_oid2.len) ||
                (iVar1 = bcmp((crl->sig_oid).p,sig_oid2.p,__n), iVar1 != 0)) ||
               ((sig_params1.len != sig_params2.len ||
                ((sig_params1.len != 0 &&
                 (iVar1 = bcmp(sig_params1.p,sig_params2.p,sig_params1.len), iVar1 != 0)))))) {
              mbedtls_x509_crl_free(crl);
              return -0x2680;
            }
            iVar1 = mbedtls_x509_get_sig(&p,puVar2,&crl->sig);
            if (iVar1 == 0) {
              if (p == puVar2) {
                return 0;
              }
              goto LAB_0010b8ef;
            }
          }
        }
        else if (iVar1 == 0) {
          local_a0 = p + entry_len;
          puVar4 = p;
          pmVar5 = &crl->entry;
          do {
            do {
              if (local_a0 <= puVar4) goto LAB_0010b86a;
              iVar1 = mbedtls_asn1_get_tag(&p,local_a0,&local_78,0x30);
              if (iVar1 != 0) goto LAB_0010b5ff;
              (pmVar5->raw).tag = (uint)*p;
              (pmVar5->raw).p = p;
              (pmVar5->raw).len = local_78;
              puVar4 = p + local_78;
              iVar1 = mbedtls_x509_get_serial(&p,puVar4,&pmVar5->serial);
              if ((iVar1 != 0) ||
                 (iVar1 = mbedtls_x509_get_time(&p,puVar4,&pmVar5->revocation_date), iVar1 != 0))
              goto LAB_0010b5ff;
              local_a8 = 0;
              if (p < puVar4) {
                (pmVar5->entry_ext).tag = (uint)*p;
                (pmVar5->entry_ext).p = p;
                len_00 = &(pmVar5->entry_ext).len;
                iVar1 = mbedtls_asn1_get_tag(&p,puVar4,len_00,0x30);
                if (iVar1 == 0) {
                  puVar4 = p + *len_00;
                  for (; p < puVar4; p = p + local_a8) {
                    iVar1 = mbedtls_asn1_get_tag(&p,puVar4,&local_a8,0x30);
                    if (iVar1 != 0) goto LAB_0010b82a;
                  }
                  if (p != puVar4) goto LAB_0010b8cf;
                }
                else if (iVar1 == -0x62) {
                  (pmVar5->entry_ext).p = (uchar *)0x0;
                }
                else {
LAB_0010b82a:
                  iVar1 = iVar1 + -0x2500;
                  if (iVar1 != 0) goto LAB_0010b5ff;
                }
              }
              puVar4 = p;
            } while (local_a0 <= p);
            pmVar3 = (mbedtls_x509_crl_entry *)calloc(1,0x68);
            pmVar5->next = pmVar3;
            pmVar5 = pmVar3;
          } while (pmVar3 != (mbedtls_x509_crl_entry *)0x0);
          iVar1 = -0x2880;
        }
      }
    }
  }
LAB_0010b5ff:
  mbedtls_x509_crl_free(crl);
  return iVar1;
}

Assistant:

int mbedtls_x509_crl_parse_der( mbedtls_x509_crl *chain,
                        const unsigned char *buf, size_t buflen )
{
    int ret;
    size_t len;
    unsigned char *p, *end;
    mbedtls_x509_buf sig_params1, sig_params2, sig_oid2;
    mbedtls_x509_crl *crl = chain;

    /*
     * Check for valid input
     */
    if( crl == NULL || buf == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    memset( &sig_params1, 0, sizeof( mbedtls_x509_buf ) );
    memset( &sig_params2, 0, sizeof( mbedtls_x509_buf ) );
    memset( &sig_oid2, 0, sizeof( mbedtls_x509_buf ) );

    /*
     * Add new CRL on the end of the chain if needed.
     */
    while( crl->version != 0 && crl->next != NULL )
        crl = crl->next;

    if( crl->version != 0 && crl->next == NULL )
    {
        crl->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_crl ) );

        if( crl->next == NULL )
        {
            mbedtls_x509_crl_free( crl );
            return( MBEDTLS_ERR_X509_ALLOC_FAILED );
        }

        mbedtls_x509_crl_init( crl->next );
        crl = crl->next;
    }

    /*
     * Copy raw DER-encoded CRL
     */
    if( ( p = mbedtls_calloc( 1, buflen ) ) == NULL )
        return( MBEDTLS_ERR_X509_ALLOC_FAILED );

    memcpy( p, buf, buflen );

    crl->raw.p = p;
    crl->raw.len = buflen;

    end = p + buflen;

    /*
     * CertificateList  ::=  SEQUENCE  {
     *      tbsCertList          TBSCertList,
     *      signatureAlgorithm   AlgorithmIdentifier,
     *      signatureValue       BIT STRING  }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT );
    }

    if( len != (size_t) ( end - p ) )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    /*
     * TBSCertList  ::=  SEQUENCE  {
     */
    crl->tbs.p = p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    end = p + len;
    crl->tbs.len = end - crl->tbs.p;

    /*
     * Version  ::=  INTEGER  OPTIONAL {  v1(0), v2(1)  }
     *               -- if present, MUST be v2
     *
     * signature            AlgorithmIdentifier
     */
    if( ( ret = x509_crl_get_version( &p, end, &crl->version ) ) != 0 ||
        ( ret = mbedtls_x509_get_alg( &p, end, &crl->sig_oid, &sig_params1 ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    crl->version++;

    if( crl->version > 2 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_UNKNOWN_VERSION );
    }

    if( ( ret = mbedtls_x509_get_sig_alg( &crl->sig_oid, &sig_params1,
                                  &crl->sig_md, &crl->sig_pk,
                                  &crl->sig_opts ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_UNKNOWN_SIG_ALG );
    }

    /*
     * issuer               Name
     */
    crl->issuer_raw.p = p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    if( ( ret = mbedtls_x509_get_name( &p, p + len, &crl->issuer ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    crl->issuer_raw.len = p - crl->issuer_raw.p;

    /*
     * thisUpdate          Time
     * nextUpdate          Time OPTIONAL
     */
    if( ( ret = mbedtls_x509_get_time( &p, end, &crl->this_update ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    if( ( ret = mbedtls_x509_get_time( &p, end, &crl->next_update ) ) != 0 )
    {
        if( ret != ( MBEDTLS_ERR_X509_INVALID_DATE +
                        MBEDTLS_ERR_ASN1_UNEXPECTED_TAG ) &&
            ret != ( MBEDTLS_ERR_X509_INVALID_DATE +
                        MBEDTLS_ERR_ASN1_OUT_OF_DATA ) )
        {
            mbedtls_x509_crl_free( crl );
            return( ret );
        }
    }

    /*
     * revokedCertificates    SEQUENCE OF SEQUENCE   {
     *      userCertificate        CertificateSerialNumber,
     *      revocationDate         Time,
     *      crlEntryExtensions     Extensions OPTIONAL
     *                                   -- if present, MUST be v2
     *                        } OPTIONAL
     */
    if( ( ret = x509_get_entries( &p, end, &crl->entry ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    /*
     * crlExtensions          EXPLICIT Extensions OPTIONAL
     *                              -- if present, MUST be v2
     */
    if( crl->version == 2 )
    {
        ret = x509_get_crl_ext( &p, end, &crl->crl_ext );

        if( ret != 0 )
        {
            mbedtls_x509_crl_free( crl );
            return( ret );
        }
    }

    if( p != end )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    end = crl->raw.p + crl->raw.len;

    /*
     *  signatureAlgorithm   AlgorithmIdentifier,
     *  signatureValue       BIT STRING
     */
    if( ( ret = mbedtls_x509_get_alg( &p, end, &sig_oid2, &sig_params2 ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    if( crl->sig_oid.len != sig_oid2.len ||
        memcmp( crl->sig_oid.p, sig_oid2.p, crl->sig_oid.len ) != 0 ||
        sig_params1.len != sig_params2.len ||
        ( sig_params1.len != 0 &&
          memcmp( sig_params1.p, sig_params2.p, sig_params1.len ) != 0 ) )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_SIG_MISMATCH );
    }

    if( ( ret = mbedtls_x509_get_sig( &p, end, &crl->sig ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    if( p != end )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    return( 0 );
}